

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpinLock.hpp
# Opt level: O0

void __thiscall Threading::SpinLock::lock(SpinLock *this)

{
  bool bVar1;
  bool WasLocked;
  SpinLock *this_local;
  
  while( true ) {
    bVar1 = std::atomic<bool>::exchange(&this->m_IsLocked,true,memory_order_acquire);
    if (!bVar1) break;
    Wait(this);
  }
  return;
}

Assistant:

void lock() noexcept
    {
        while (true)
        {
            // Assume that lock is free on the first try.
            const auto WasLocked = m_IsLocked.exchange(true, std::memory_order_acquire);
            if (!WasLocked)
                return; // The lock was not acquired when this thread performed the exchange

            Wait();
        }
    }